

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

void __thiscall CppGenerator::~CppGenerator(CppGenerator *this)

{
  string *psVar1;
  element_type *this_00;
  size_t sVar2;
  vector<DependentComputation,_std::allocator<DependentComputation>_> *this_01;
  CodeGenerator *in_RDI;
  string *this_02;
  size_t rel;
  ulong local_10;
  
  in_RDI->_vptr_CodeGenerator = (_func_int **)&PTR__CppGenerator_0037fc18;
  psVar1 = (string *)in_RDI[0x22]._vptr_CodeGenerator;
  if (psVar1 != (string *)0x0) {
    this_02 = psVar1 + (long)*(_func_int **)(psVar1 + -8) * 0x20;
    while (psVar1 != this_02) {
      this_02 = this_02 + -0x20;
      std::__cxx11::string::~string(this_02);
    }
    operator_delete__(psVar1 + -8);
  }
  local_10 = 0;
  while( true ) {
    this_00 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x28156e);
    sVar2 = TreeDecomposition::numberOfRelations(this_00);
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x28158b);
    this_01 = (vector<DependentComputation,_std::allocator<DependentComputation>_> *)
              QueryCompiler::numberOfViews((QueryCompiler *)0x281593);
    if ((long)&(((_Vector_base<DependentLoop,_std::allocator<DependentLoop>_> *)
                &this_01->
                 super__Vector_base<DependentComputation,_std::allocator<DependentComputation>_>)->
               _M_impl).super__Vector_impl_data._M_start + sVar2 <= local_10) break;
    if (in_RDI[0x21]._vptr_CodeGenerator[local_10] != (_func_int *)0x0) {
      operator_delete__(in_RDI[0x21]._vptr_CodeGenerator[local_10]);
    }
    local_10 = local_10 + 1;
  }
  if (in_RDI[0x21]._vptr_CodeGenerator != (_func_int **)0x0) {
    operator_delete__(in_RDI[0x21]._vptr_CodeGenerator);
  }
  if (in_RDI[0x16]._vptr_CodeGenerator != (_func_int **)0x0) {
    operator_delete__(in_RDI[0x16]._vptr_CodeGenerator);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_01);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_01);
  std::
  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
  ::~vector((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
             *)this_01);
  std::
  vector<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
             *)this_01);
  std::
  vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
  ::~vector((vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
             *)this_01);
  std::
  vector<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
  ::~vector((vector<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
             *)this_01);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_01);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_01);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_01);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_01);
  std::vector<DependentLoop,_std::allocator<DependentLoop>_>::~vector
            ((vector<DependentLoop,_std::allocator<DependentLoop>_> *)this_01);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_01);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_01);
  std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::~vector
            ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)this_01);
  std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::~vector
            ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)this_01);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_01);
  std::vector<DependentComputation,_std::allocator<DependentComputation>_>::~vector(this_01);
  std::
  vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
  ::~vector((vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
             *)this_01);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_01);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_01);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_01);
  std::
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             *)this_01);
  std::
  vector<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>,_std::allocator<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>_>_>
  ::~vector((vector<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>,_std::allocator<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>_>_>
             *)this_01);
  std::
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             *)this_01);
  std::
  vector<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>,_std::allocator<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>_>_>
  ::~vector((vector<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>,_std::allocator<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>_>_>
             *)this_01);
  std::
  vector<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>_>_>
  ::~vector((vector<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>_>_>
             *)this_01);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_01);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_01);
  std::
  vector<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
             *)this_01);
  std::
  vector<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
  ::~vector((vector<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
             *)this_01);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_01);
  std::
  vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
  ::~vector((vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
             *)this_01);
  std::
  vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
  ::~vector((vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
             *)this_01);
  std::
  vector<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
  ::~vector((vector<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
             *)this_01);
  std::
  vector<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
  ::~vector((vector<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
             *)this_01);
  std::
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             *)this_01);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_01);
  std::
  vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
  ::~vector((vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
             *)this_01);
  std::
  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
  ::~vector((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
             *)this_01);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2818e9);
  std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::~vector
            ((vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> *)this_01);
  std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::~vector
            ((vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> *)this_01);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_01);
  std::__cxx11::string::~string((string *)(in_RDI + 0x4b));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_01);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_01);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_01);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_01);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_01);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_01);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_01);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_01);
  std::
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             *)this_01);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)this_01);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                    *)0x2819e8);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_01);
  std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::~vector
            ((vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> *)this_01);
  std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::~vector
            ((vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> *)this_01);
  std::shared_ptr<QueryCompiler>::~shared_ptr((shared_ptr<QueryCompiler> *)0x281a29);
  std::shared_ptr<TreeDecomposition>::~shared_ptr((shared_ptr<TreeDecomposition> *)0x281a37);
  std::__cxx11::string::~string((string *)(in_RDI + 9));
  std::__cxx11::string::~string((string *)(in_RDI + 5));
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  CodeGenerator::~CodeGenerator(in_RDI);
  return;
}

Assistant:

CppGenerator::~CppGenerator()
{
    delete[] viewName;
    for (size_t rel = 0; rel < _td->numberOfRelations() + _qc->numberOfViews(); ++rel)
        delete[] sortOrders[rel];
    delete[] sortOrders;
    delete[] viewLevelRegister;
}